

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking64.h
# Opt level: O3

void packforblock2_64(uint64_t base,uint64_t **pin,uint8_t **pw)

{
  uint64_t *puVar1;
  int iVar2;
  long lVar4;
  undefined1 auVar3 [16];
  
  puVar1 = *pin;
  iVar2 = (int)base;
  auVar3._8_4_ = iVar2;
  auVar3._0_8_ = base;
  auVar3._12_4_ = (int)(base >> 0x20);
  lVar4 = auVar3._8_8_;
  *(uint64_t *)*pw =
       (puVar1[6] - lVar4) * 0x1000 | (puVar1[0xe] - lVar4) * 0x10000000 |
       (puVar1[2] - lVar4) * 0x10 | (puVar1[10] - lVar4) * 0x100000 |
       (puVar1[8] - lVar4) * 0x10000 | puVar1[0x10] - lVar4 << 0x20 |
       (puVar1[4] - lVar4) * 0x100 | (puVar1[0xc] - lVar4) * 0x1000000 |
       (puVar1[5] - base) * 0x400 | (puVar1[0xd] - base) * 0x4000000 |
       (puVar1[1] - base) * 4 | (puVar1[9] - base) * 0x40000 |
       (puVar1[7] - base) * 0x4000 | (puVar1[0xf] - base) * 0x40000000 |
       (puVar1[3] - base) * 0x40 | (puVar1[0xb] - base) * 0x400000 |
       (ulong)(uint)((int)puVar1[0x1f] - iVar2) << 0x3e |
       (ulong)(uint)((int)puVar1[0x1e] - iVar2) << 0x3c |
       (ulong)(uint)((int)puVar1[0x1d] - iVar2) << 0x3a |
       (ulong)(uint)((int)puVar1[0x1c] - iVar2) << 0x38 |
       (ulong)(uint)((int)puVar1[0x1b] - iVar2) << 0x36 |
       (ulong)(uint)((int)puVar1[0x1a] - iVar2) << 0x34 |
       (ulong)(uint)((int)puVar1[0x19] - iVar2) << 0x32 |
       (ulong)(uint)((int)puVar1[0x18] - iVar2) << 0x30 |
       (ulong)(uint)((int)puVar1[0x17] - iVar2) << 0x2e |
       (ulong)(uint)((int)puVar1[0x16] - iVar2) << 0x2c |
       (ulong)(uint)((int)puVar1[0x15] - iVar2) << 0x2a |
       (ulong)(uint)((int)puVar1[0x14] - iVar2) << 0x28 |
       (ulong)(uint)((int)puVar1[0x13] - iVar2) << 0x26 |
       (ulong)(uint)((int)puVar1[0x12] - iVar2) << 0x24 |
       (ulong)(uint)((int)puVar1[0x11] - iVar2) << 0x22 | *puVar1 - base;
  *pin = puVar1 + 0x20;
  *pw = *pw + 8;
  return;
}

Assistant:

static void packforblock2_64(const uint64_t base, const uint64_t ** pin, uint8_t ** pw) {
  uint64_t * pw64 = *(uint64_t **) pw;
  const uint64_t * in = *pin;
  /* we are going to touch  1 64-bit word */ 
  uint64_t w0;
  w0 = (in[0] - base);
  w0 |=  (in[1] - base) << 2;
  w0 |=  (in[2] - base) << 4;
  w0 |=  (in[3] - base) << 6;
  w0 |=  (in[4] - base) << 8;
  w0 |=  (in[5] - base) << 10;
  w0 |=  (in[6] - base) << 12;
  w0 |=  (in[7] - base) << 14;
  w0 |=  (in[8] - base) << 16;
  w0 |=  (in[9] - base) << 18;
  w0 |=  (in[10] - base) << 20;
  w0 |=  (in[11] - base) << 22;
  w0 |=  (in[12] - base) << 24;
  w0 |=  (in[13] - base) << 26;
  w0 |=  (in[14] - base) << 28;
  w0 |=  (in[15] - base) << 30;
  w0 |=  (in[16] - base) << 32;
  w0 |=  (in[17] - base) << 34;
  w0 |=  (in[18] - base) << 36;
  w0 |=  (in[19] - base) << 38;
  w0 |=  (in[20] - base) << 40;
  w0 |=  (in[21] - base) << 42;
  w0 |=  (in[22] - base) << 44;
  w0 |=  (in[23] - base) << 46;
  w0 |=  (in[24] - base) << 48;
  w0 |=  (in[25] - base) << 50;
  w0 |=  (in[26] - base) << 52;
  w0 |=  (in[27] - base) << 54;
  w0 |=  (in[28] - base) << 56;
  w0 |=  (in[29] - base) << 58;
  w0 |=  (in[30] - base) << 60;
  w0 |=  (in[31] - base) << 62;
  pw64[0] = w0;
  *pin += 32; /* we consumed 32 64-bit integers */ 
  *pw += 8; /* we used up 8 output bytes */ 
}